

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterInternalFormatAnyOf
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int *refValues,
               int numRefValues,QueryType type)

{
  bool bVar1;
  DataType DVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  GLint *pGVar5;
  GLfloat *pGVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_5f0;
  MessageBuilder local_5e0;
  int local_45c;
  GetNameFunc p_Stack_458;
  int ndx_2;
  int local_450;
  Enum<int,_2UL> local_448;
  MessageBuilder local_438;
  int local_2b8;
  undefined4 local_2b4;
  int ndx_1;
  int local_2a8;
  Enum<int,_2UL> local_2a0;
  int local_28c;
  GetNameFunc p_Stack_288;
  int ndx;
  int local_280;
  Enum<int,_2UL> local_278;
  undefined1 local_268 [8];
  MessageBuilder msg;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  ResultCollector result;
  QueriedState state;
  int numRefValues_local;
  int *refValues_local;
  GLenum pname_local;
  int level_local;
  GLenum target_local;
  CallLogWrapper *gl_local;
  
  deqp::gls::StateQueryUtil::QueriedState::QueriedState
            ((QueriedState *)((long)&result.m_message.field_2 + 8));
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0," // ERROR: ",&local_d1);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_b0,pTVar3,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_268,pTVar3);
  pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_268,(char (*) [11])"Verifying ");
  EVar7 = glu::getTextureLevelParameterStr(pname);
  p_Stack_288 = EVar7.m_getName;
  local_280 = EVar7.m_value;
  local_278.m_getName = p_Stack_288;
  local_278.m_value = local_280;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_278);
  tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])", expecting any of {");
  for (local_28c = 0; local_28c < numRefValues; local_28c = local_28c + 1) {
    if (local_28c != 0) {
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_268,(char (*) [3])0x2a3caab);
    }
    EVar7 = glu::getTextureFormatStr(refValues[local_28c]);
    _ndx_1 = EVar7.m_getName;
    local_2a8 = EVar7.m_value;
    local_2a0.m_getName = _ndx_1;
    local_2a0.m_value = local_2a8;
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_268,&local_2a0);
  }
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_268,(char (*) [2])0x2b6f7db);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_268);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            ((ResultCollector *)local_b0,gl,type,target,level,pname,
             (QueriedState *)((long)&result.m_message.field_2 + 8));
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined
                    ((QueriedState *)((long)&result.m_message.field_2 + 8));
  if (bVar1) {
    gl_local._7_1_ = false;
  }
  else {
    DVar2 = deqp::gls::StateQueryUtil::QueriedState::getType
                      ((QueriedState *)((long)&result.m_message.field_2 + 8));
    if (DVar2 == DATATYPE_INTEGER) {
      for (local_2b8 = 0; local_2b8 < numRefValues; local_2b8 = local_2b8 + 1) {
        pGVar5 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess
                           ((QueriedState *)((long)&result.m_message.field_2 + 8));
        if (*pGVar5 == refValues[local_2b8]) {
          gl_local._7_1_ = true;
          goto LAB_0218e37f;
        }
      }
      pTVar3 = glu::CallLogWrapper::getLog(gl);
      tcu::TestLog::operator<<(&local_438,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_438,(char (*) [12])"Error: got ");
      pGVar5 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess
                         ((QueriedState *)((long)&result.m_message.field_2 + 8));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pGVar5);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [4])0x2bfbf8b);
      pGVar5 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess
                         ((QueriedState *)((long)&result.m_message.field_2 + 8));
      EVar7 = glu::getTextureFormatStr(*pGVar5);
      p_Stack_458 = EVar7.m_getName;
      local_450 = EVar7.m_value;
      local_448.m_getName = p_Stack_458;
      local_448.m_value = local_450;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_448);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_438);
      gl_local._7_1_ = false;
    }
    else if (DVar2 == DATATYPE_FLOAT) {
      for (local_45c = 0; local_45c < numRefValues; local_45c = local_45c + 1) {
        pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess
                           ((QueriedState *)((long)&result.m_message.field_2 + 8));
        if ((*pGVar6 == (float)refValues[local_45c]) &&
           (!NAN(*pGVar6) && !NAN((float)refValues[local_45c]))) {
          gl_local._7_1_ = true;
          goto LAB_0218e37f;
        }
      }
      pTVar3 = glu::CallLogWrapper::getLog(gl);
      tcu::TestLog::operator<<(&local_5e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_5e0,(char (*) [12])"Error: got ");
      pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess
                         ((QueriedState *)((long)&result.m_message.field_2 + 8));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,pGVar6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [4])0x2bfbf8b);
      pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess
                         ((QueriedState *)((long)&result.m_message.field_2 + 8));
      EVar7 = glu::getTextureFormatStr((int)*pGVar6);
      local_5f0.m_getName = EVar7.m_getName;
      local_5f0.m_value = EVar7.m_value;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_5f0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_5e0);
      gl_local._7_1_ = false;
    }
    else {
      gl_local._7_1_ = false;
    }
  }
LAB_0218e37f:
  local_2b4 = 1;
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_b0);
  return gl_local._7_1_;
}

Assistant:

static bool verifyTextureLevelParameterInternalFormatAnyOf (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, const int* refValues, int numRefValues, QueryType type)
{
	QueriedState			state;
	tcu::ResultCollector	result	(gl.getLog(), " // ERROR: ");

	// Log what we try to do
	{
		tcu::MessageBuilder msg(&gl.getLog());

		msg << "Verifying " << glu::getTextureLevelParameterStr(pname) << ", expecting any of {";
		for (int ndx = 0; ndx < numRefValues; ++ndx)
		{
			if (ndx != 0)
				msg << ", ";
			msg << glu::getTextureFormatStr(refValues[ndx]);
		}
		msg << "}";
		msg << tcu::TestLog::EndMessage;
	}

	queryTextureLevelState(result, gl, type, target, level, pname, state);
	if (state.isUndefined())
		return false;

	// verify
	switch (state.getType())
	{
		case DATATYPE_INTEGER:
		{
			for (int ndx = 0; ndx < numRefValues; ++ndx)
				if (state.getIntAccess() == refValues[ndx])
					return true;

			gl.getLog() << tcu::TestLog::Message << "Error: got " << state.getIntAccess() << ", (" << glu::getTextureFormatStr(state.getIntAccess()) << ")" << tcu::TestLog::EndMessage;
			return false;
		}
		case DATATYPE_FLOAT:
		{
			for (int ndx = 0; ndx < numRefValues; ++ndx)
				if (state.getFloatAccess() == (float)refValues[ndx])
					return true;

			gl.getLog() << tcu::TestLog::Message << "Error: got " << state.getFloatAccess() << ", (" << glu::getTextureFormatStr((int)state.getFloatAccess()) << ")" << tcu::TestLog::EndMessage;
			return false;
		}
		default:
			DE_ASSERT(DE_FALSE);
			return false;
	}
}